

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O0

int lws_sql_purify_len(char *p)

{
  int local_14;
  char *pcStack_10;
  int olen;
  char *p_local;
  
  local_14 = 0;
  pcStack_10 = p;
  while (*pcStack_10 != '\0') {
    if (*pcStack_10 == '\'') {
      local_14 = local_14 + 1;
    }
    local_14 = local_14 + 1;
    pcStack_10 = pcStack_10 + 1;
  }
  return local_14;
}

Assistant:

int
lws_sql_purify_len(const char *p)
{
	int olen = 0;

	while (*p) {
		if (*p++ == '\'')
			olen++;
		olen++;
	}

	return olen;
}